

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O1

void __thiscall
Js::ProbeContainer::RegisterContextToDiag
          (ProbeContainer *this,DWORD_PTR context,ArenaAllocator *alloc)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  List<unsigned_long,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar5;
  
  bVar3 = ScriptContext::IsScriptContextInSourceRundownOrDebugMode(this->pScriptContext);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                ,0x3d0,
                                "(this->pScriptContext->IsScriptContextInSourceRundownOrDebugMode())"
                                ,"this->pScriptContext->IsScriptContextInSourceRundownOrDebugMode()"
                               );
    if (!bVar3) goto LAB_008d8708;
    *puVar4 = 0;
  }
  if (alloc == (ArenaAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                ,0x3d1,"(alloc)","alloc");
    if (!bVar3) {
LAB_008d8708:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (this->registeredFuncContextList ==
      (List<unsigned_long,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
      0x0) {
    pLVar5 = (List<unsigned_long,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)new<Memory::ArenaAllocator>(0x30,alloc,0x366bee);
    (pLVar5->super_ReadOnlyList<unsigned_long,_Memory::ArenaAllocator,_DefaultComparer>).buffer =
         (Type)0x0;
    (pLVar5->super_ReadOnlyList<unsigned_long,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
    (pLVar5->super_ReadOnlyList<unsigned_long,_Memory::ArenaAllocator,_DefaultComparer>).alloc =
         alloc;
    (pLVar5->super_ReadOnlyList<unsigned_long,_Memory::ArenaAllocator,_DefaultComparer>).
    _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014fa878;
    pLVar5->length = 0;
    pLVar5->increment = 4;
    this->registeredFuncContextList = pLVar5;
  }
  pLVar5 = this->registeredFuncContextList;
  JsUtil::List<unsigned_long,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::EnsureArray(pLVar5,0);
  iVar1 = (pLVar5->super_ReadOnlyList<unsigned_long,_Memory::ArenaAllocator,_DefaultComparer>).count
  ;
  (pLVar5->super_ReadOnlyList<unsigned_long,_Memory::ArenaAllocator,_DefaultComparer>).buffer[iVar1]
       = context;
  (pLVar5->super_ReadOnlyList<unsigned_long,_Memory::ArenaAllocator,_DefaultComparer>).count =
       iVar1 + 1;
  return;
}

Assistant:

void ProbeContainer::RegisterContextToDiag(DWORD_PTR context, ArenaAllocator *alloc)
    {
        Assert(this->pScriptContext->IsScriptContextInSourceRundownOrDebugMode());
        Assert(alloc);

        if (registeredFuncContextList == nullptr)
        {
            registeredFuncContextList = JsUtil::List<DWORD_PTR, ArenaAllocator>::New(alloc);
        }

        registeredFuncContextList->Add(context);
    }